

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void * rw::imageClose(void *object,int32 offset,int32 size)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  
  lVar1 = engine + imageModuleOffset;
  puVar2 = (undefined8 *)(engine + imageModuleOffset);
  puVar3 = puVar2 + 2;
  (*DAT_00144da0)(*puVar2);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 1) = 0;
  for (lVar4 = 0; lVar4 < *(int *)(lVar1 + 0x100); lVar4 = lVar4 + 1) {
    (*DAT_00144da0)(*puVar3);
    puVar3 = puVar3 + 3;
  }
  *(undefined4 *)(lVar1 + 0x100) = 0;
  return object;
}

Assistant:

static void*
imageClose(void *object, int32 offset, int32 size)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	int i;
	rwFree(g->searchPaths);
	g->searchPaths = nil;
	g->numSearchPaths = 0;
	for(i = 0; i < g->numFileFormats; i++)
		rwFree(g->fileFormats[i].extension);
	g->numFileFormats = 0;
	return object;
}